

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::up(TimerMgr *this,size_t idx)

{
  pointer ppTVar1;
  ulong idx2;
  
  while ((1 < idx &&
         (idx2 = idx >> 1,
         ppTVar1 = (this->elements).
                   super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         ppTVar1[idx - 1]->mExpiredTime < ppTVar1[idx2 - 1]->mExpiredTime))) {
    swap(this,idx,idx2);
    idx = idx2;
  }
  return;
}

Assistant:

void up(size_t idx) {
		auto p = parent(idx);
		while(p > 0) {
			auto offsetIdx = getOffset(idx);
			auto offsetP = getOffset(p);
			if(this->elements[offsetIdx]->mExpiredTime < this->elements[offsetP]->mExpiredTime) {
				this->swap(idx,p);
				idx = p;
				p = parent(idx);
			} else {
				break;
			}
		}
	}